

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepScanLineInputFile::readPixels(DeepScanLineInputFile *this,int scanLine1,int scanLine2)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  pointer ppLVar2;
  LineBuffer *pLVar3;
  unsigned_long uVar4;
  InputStreamMutex *pIVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar9;
  Task *this_00;
  ostream *poVar10;
  ArgExc *pAVar11;
  InputExc *pIVar12;
  IoExc *this_01;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  string *psVar17;
  string *text;
  void *__stat_loc;
  int iVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  stringstream _iex_throw_s;
  TaskGroup taskGroup;
  int local_340;
  undefined4 uStack_33c;
  ostream local_330 [376];
  TaskGroup local_1b8 [49];
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  pDVar1 = this->_data;
  if ((pDVar1->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar1->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar11,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  iVar18 = scanLine2;
  iVar7 = scanLine1;
  if (scanLine2 < scanLine1) {
    iVar18 = scanLine1;
    iVar7 = scanLine2;
  }
  iVar20 = pDVar1->minY;
  if ((iVar7 < iVar20) || (pDVar1->maxY < iVar18)) {
    pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (pAVar11,"Tried to read scan line outside the image file\'s data window.");
    __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  iVar8 = scanLine1;
  if (scanLine2 < scanLine1) {
    iVar8 = scanLine2;
  }
  lVar13 = 0;
  do {
    if ((pDVar1->gotSampleCount)._data[lVar13 + ((long)iVar8 - (long)iVar20)] == false) {
      pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc
                (pAVar11,
                 "Tried to read scan line without knowing the sample counts, pleaseread the sample counts first."
                );
      __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    lVar13 = lVar13 + 1;
  } while ((((scanLine2 + scanLine1) - iVar7) - iVar8) + 1 != (int)lVar13);
  bVar21 = pDVar1->lineOrder != INCREASING_Y;
  iVar8 = pDVar1->linesInBuffer;
  iVar16 = iVar7;
  iVar15 = iVar18;
  if (!bVar21) {
    iVar16 = iVar18;
    iVar15 = iVar7;
  }
  iVar15 = (iVar15 - iVar20) / iVar8;
  IlmThread_2_5::TaskGroup::TaskGroup(local_1b8);
  iVar20 = (iVar16 - iVar20) / iVar8 + (-(uint)bVar21 | 1);
  if (iVar15 != iVar20) {
    uVar19 = (ulong)iVar15;
    do {
      pDVar1 = this->_data;
      ppLVar2 = (pDVar1->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __stat_loc = (void *)((long)(pDVar1->lineBuffers).
                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3);
      pLVar3 = ppLVar2[uVar19 % (ulong)__stat_loc];
      IlmThread_2_5::Semaphore::wait
                ((Semaphore *)((long)&(pLVar3->exception).field_2 + 8),__stat_loc);
      iVar8 = (int)uVar19;
      if (iVar8 != pLVar3->scanLineMax) {
        iVar15 = pDVar1->linesInBuffer;
        iVar16 = iVar15 * iVar8 + pDVar1->minY;
        *(int *)&pLVar3->endOfLineBufferData = iVar16;
        *(int *)((long)&pLVar3->endOfLineBufferData + 4) = iVar15 + iVar16 + -1;
        pLVar3->scanLineMax = iVar8;
        (pLVar3->buffer)._size = 0;
        uVar4 = (pDVar1->lineOffsets).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
        if (uVar4 == 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,"Scan line ",10);
          poVar10 = (ostream *)std::ostream::operator<<(local_330,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," is missing.",0xc);
          pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar12,(stringstream *)&local_340);
          __cxa_throw(pIVar12,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        pIVar5 = pDVar1->_streamData;
        if ((pDVar1->version & 0x1000) == 0) {
          if (pDVar1->nextLineBufferMinY != iVar16) {
LAB_001f8194:
            (*pIVar5->is->_vptr_IStream[6])(pIVar5->is,uVar4);
          }
        }
        else {
          iVar8 = (*pIVar5->is->_vptr_IStream[5])();
          if (CONCAT44(extraout_var,iVar8) !=
              (pDVar1->lineOffsets).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19]) goto LAB_001f8194;
        }
        if (((pDVar1->version & 0x1000) != 0) &&
           ((*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4),
           local_340 != pDVar1->partNumber)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_330,"Unexpected part number ",0x17);
          poVar10 = (ostream *)std::ostream::operator<<(local_330,local_340);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", should be ",0xc);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,pDVar1->partNumber);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
          pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&local_340);
          __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4);
        if (local_340 != iVar16) {
          pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar12,"Unexpected data block y coordinate.");
          __cxa_throw(pIVar12,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,8);
        iVar8 = local_340;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,8);
        pLVar3->dataPtr = (char *)CONCAT44(uStack_33c,local_340);
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,8);
        *(ulong *)&pLVar3->dataSize = CONCAT44(uStack_33c,local_340);
        if (((char *)0x7fffffff < pLVar3->dataPtr) || (CONCAT44(uStack_33c,local_340) >> 0x1f != 0))
        {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_330,"This version of the library does not support ",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_330,"the allocation of data with size  > ",0x24);
          poVar10 = (ostream *)std::ostream::operator<<(local_330,0x7fffffff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," file unpacked size :",0x15);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," file packed size   :",0x15);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
          pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&local_340);
          __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar5->is,iVar8);
        iVar8 = (*pIVar5->is->_vptr_IStream[2])();
        if ((char)iVar8 == '\0') {
          pcVar6 = (pLVar3->buffer)._data;
          if (pcVar6 != (char *)0x0) {
            operator_delete__(pcVar6);
          }
          pcVar6 = pLVar3->dataPtr;
          pcVar9 = (char *)operator_new__((ulong)pcVar6);
          (pLVar3->buffer)._data = pcVar9;
          (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,pcVar9,(ulong)pcVar6 & 0xffffffff);
        }
        else {
          iVar8 = (*pIVar5->is->_vptr_IStream[4])(pIVar5->is,(ulong)*(uint *)&pLVar3->dataPtr);
          (pLVar3->buffer)._data = (char *)CONCAT44(extraout_var_00,iVar8);
        }
        iVar8 = -pDVar1->linesInBuffer;
        if (pDVar1->lineOrder == INCREASING_Y) {
          iVar8 = pDVar1->linesInBuffer;
        }
        pDVar1->nextLineBufferMinY = iVar8 + iVar16;
      }
      iVar8 = *(int *)&pLVar3->endOfLineBufferData;
      iVar15 = *(int *)((long)&pLVar3->endOfLineBufferData + 4);
      this_00 = (Task *)operator_new(0x28);
      IlmThread_2_5::Task::Task(this_00,local_1b8);
      if (iVar18 <= iVar15) {
        iVar15 = iVar18;
      }
      if (iVar8 <= iVar7) {
        iVar8 = iVar7;
      }
      this_00->_vptr_Task = (_func_int **)&PTR__LineBufferTask_0049dc80;
      this_00[1]._vptr_Task = (_func_int **)pDVar1;
      this_00[1]._group = (TaskGroup *)pLVar3;
      *(int *)&this_00[2]._vptr_Task = iVar8;
      *(int *)((long)&this_00[2]._vptr_Task + 4) = iVar15;
      IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
      uVar19 = uVar19 + (-(ulong)bVar21 | 1);
    } while (iVar20 != (int)uVar19);
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(local_1b8);
  ppLVar2 = (this->_data->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(this->_data->lineBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 3;
    lVar14 = 0;
    psVar17 = (string *)0x0;
    do {
      pLVar3 = ppLVar2[lVar14];
      text = (string *)&pLVar3->partiallyFull;
      if (psVar17 != (string *)0x0) {
        text = psVar17;
      }
      if (*(char *)&pLVar3->compressor == '\0') {
        text = psVar17;
      }
      *(undefined1 *)&pLVar3->compressor = 0;
      lVar14 = lVar14 + 1;
      psVar17 = text;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar14);
    if (text != (string *)0x0) {
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::IoExc::IoExc(this_01,text);
      __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepScanLineInputFile::readPixels (int scanLine1, int scanLine2)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data destination.");

        int scanLineMin = min (scanLine1, scanLine2);
        int scanLineMax = max (scanLine1, scanLine2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
                               "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            if (_data->gotSampleCount[i - _data->minY] == false)
                throw IEX_NAMESPACE::ArgExc ("Tried to read scan line without "
                                   "knowing the sample counts, please"
                                   "read the sample counts first.");
        }

 
        //
        // We impose a numbering scheme on the lineBuffers where the first
        // scanline is contained in lineBuffer 1.
        //
        // Determine the first and last lineBuffer numbers in this scanline
        // range. We always attempt to read the scanlines in the order that
        // they are stored in the file.
        //

        int start, stop, dl;

        if (_data->lineOrder == INCREASING_Y)
        {
            start = (scanLineMin - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMax - _data->minY) / _data->linesInBuffer + 1;
            dl = 1;
        }
        else
        {
            start = (scanLineMax - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMin - _data->minY) / _data->linesInBuffer - 1;
            dl = -1;
        }

        //
        // Create a task group for all line buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add the line buffer tasks.
            //
            // The tasks will execute in the order that they are created
            // because we lock the line buffers during construction and the
            // constructors are called by the main thread.  Hence, in order
            // for a successive task to execute the previous task which
            // used that line buffer must have completed already.
            //

            for (int l = start; l != stop; l += dl)
            {
                ThreadPool::addGlobalTask (newLineBufferTask (&taskGroup,
                                                              _data, l,
                                                              scanLineMin,
                                                              scanLineMax));
            }

            //
            // finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // LineBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to ScanLineInputFile::readPixels().
        // LineBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the line buffers.
        // Now we check if any line buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple line buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
        {
            LineBuffer *lineBuffer = _data->lineBuffers[i];

            if (lineBuffer->hasException && !exception)
                exception = &lineBuffer->exception;

            lineBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}